

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O0

void __thiscall pzgeom::TPZArc3D::ComputeAtributes(TPZArc3D *this,TPZFMatrix<double> *coord)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  TPZFMatrix<double> *coord_00;
  double *ya;
  double *yb;
  double *pdVar12;
  TPZFMatrix<double> *this_00;
  TPZFMatrix<double> *TransfToOrthog;
  TPZVec<double> *this_01;
  long in_RDI;
  TPZArc3D *this_02;
  double *xb;
  double dVar13;
  double dVar14;
  _func_int **pp_Var15;
  int j;
  int i_1;
  double temp;
  TPZVec<double> Temp;
  double Yb;
  double Xb;
  double Ya;
  double Xa;
  TPZFNMatrix<9,_double> axest;
  int i;
  TPZFNMatrix<9,_double> NotUsedHere;
  TPZFNMatrix<9,_double> IBaseCnCP;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffff988;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffff990;
  int64_t in_stack_fffffffffffff998;
  TPZVec<double> *in_stack_fffffffffffff9a0;
  _func_int **in_stack_fffffffffffff9a8;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffff9b0;
  double *in_stack_fffffffffffff9b8;
  TPZManVector<double,_3> *in_stack_fffffffffffff9c0;
  TPZMatrix<double> *in_stack_fffffffffffff9c8;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffff9d0;
  int64_t in_stack_fffffffffffff9f8;
  int64_t in_stack_fffffffffffffa00;
  TPZFMatrix<double> *in_stack_fffffffffffffa08;
  TPZFMatrix<double> *Orthog;
  int local_328;
  int local_324;
  double local_320;
  TPZVec<double> local_310;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  int local_1f0;
  undefined8 local_1e0;
  undefined8 local_f8;
  TPZBaseMatrix local_f0 [7];
  
  local_f8 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffff9d0,(int64_t)in_stack_fffffffffffff9c8,
             (int64_t)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  local_1e0 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffff9d0,(int64_t)in_stack_fffffffffffff9c8,
             (int64_t)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  TPZFMatrix<double>::Resize
            (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  TPZFMatrix<double>::Resize
            (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  TPZManVector<double,_3>::Resize(in_stack_fffffffffffff9c0,(int64_t)in_stack_fffffffffffff9b8);
  for (local_1f0 = 0; local_1f0 < 3; local_1f0 = local_1f0 + 1) {
    pdVar11 = TPZFMatrix<double>::operator()
                        (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                         (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
    dVar13 = *pdVar11;
    pdVar11 = TPZFMatrix<double>::operator()
                        (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                         (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
    dVar1 = *pdVar11;
    pdVar11 = TPZFMatrix<double>::operator()
                        (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                         (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
    *pdVar11 = dVar13 - dVar1;
    pdVar11 = TPZFMatrix<double>::operator()
                        (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                         (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
    dVar13 = *pdVar11;
    pdVar11 = TPZFMatrix<double>::operator()
                        (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                         (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
    dVar1 = *pdVar11;
    pdVar11 = TPZFMatrix<double>::operator()
                        (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                         (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
    *pdVar11 = dVar13 - dVar1;
  }
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar13 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar1 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar2 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar3 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar4 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar5 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar6 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar7 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar8 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar14 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar9 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar10 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  *pdVar11 = dVar9 * dVar10 +
             (((dVar4 * dVar5 + -dVar13 * dVar1 + dVar2 * dVar3) - dVar6 * dVar7) - dVar8 * dVar14);
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar13 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar1 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar2 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar3 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar4 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar5 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar6 = *pdVar11;
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  this_02 = (TPZArc3D *)(dVar6 * *pdVar11 + ((dVar13 * dVar1 - dVar2 * dVar3) - dVar4 * dVar5));
  pdVar11 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  pdVar11 = (double *)*pdVar11;
  coord_00 = (TPZFMatrix<double> *)
             TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  xb = (double *)
       ((double)pdVar11 *
        (double)(coord_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable + (double)this_02);
  ya = TPZFMatrix<double>::operator()
                 (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                  (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar13 = *ya;
  yb = TPZFMatrix<double>::operator()
                 (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                  (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar13 = (double)xb - dVar13 * *yb;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  *pdVar12 = dVar13;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar13 = *pdVar12;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar1 = *pdVar12;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar2 = *pdVar12;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar3 = *pdVar12;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  Orthog = (TPZFMatrix<double> *)*pdVar12;
  this_00 = (TPZFMatrix<double> *)
            TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar14 = (double)Orthog *
           (double)(this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                   _vptr_TPZSavable;
  TransfToOrthog =
       (TPZFMatrix<double> *)
       TPZFMatrix<double>::operator()
                 (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                  (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  pp_Var15 = (TransfToOrthog->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
             _vptr_TPZSavable;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar4 = *pdVar12;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar5 = *pdVar12;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar6 = *pdVar12;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar7 = *pdVar12;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  dVar8 = *pdVar12;
  pdVar12 = TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
  *pdVar12 = dVar7 * dVar8 +
             (((dVar14 + -dVar13 * dVar1 + dVar2 * dVar3) - (double)pp_Var15 * dVar4) -
             dVar5 * dVar6);
  TPZBaseMatrix::Rows(local_f0);
  TPZBaseMatrix::Cols(local_f0);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffff9b0,(int64_t)in_stack_fffffffffffff9a8,
             (int64_t)in_stack_fffffffffffff9a0);
  TPZFMatrix<double>::GramSchmidt(this_00,Orthog,TransfToOrthog);
  TPZFNMatrix<9,_double>::operator=(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  TPZFMatrix<double>::Transpose
            (&in_stack_fffffffffffff9d0->super_TPZFMatrix<double>,in_stack_fffffffffffff9c8);
  ComputeR2Points(this_02,coord_00,pdVar11,ya,xb,yb);
  *(double *)(in_RDI + 0x260) = local_2d8 * 0.5;
  *(double *)(in_RDI + 0x268) =
       (local_2f0 * local_2f0 + (local_2e8 * local_2e8 - local_2d8 * local_2e8)) /
       (local_2f0 + local_2f0);
  TPZVec<double>::TPZVec
            (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,(double *)in_stack_fffffffffffff990
            );
  dVar13 = *(double *)(in_RDI + 0x260);
  pdVar11 = TPZVec<double>::operator[](&local_310,0);
  *pdVar11 = dVar13;
  dVar13 = *(double *)(in_RDI + 0x268);
  pdVar11 = TPZVec<double>::operator[](&local_310,1);
  *pdVar11 = dVar13;
  pdVar11 = TPZVec<double>::operator[](&local_310,2);
  *pdVar11 = 0.0;
  for (local_324 = 0; local_320 = 0.0, local_324 < 3; local_324 = local_324 + 1) {
    for (local_328 = 0; local_328 < 3; local_328 = local_328 + 1) {
      pdVar11 = TPZFMatrix<double>::operator()
                          (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                           (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
      in_stack_fffffffffffff9c8 = (TPZMatrix<double> *)*pdVar11;
      in_stack_fffffffffffff9d0 =
           (TPZFNMatrix<9,_double> *)TPZVec<double>::operator[](&local_310,(long)local_328);
      local_320 = (double)in_stack_fffffffffffff9c8 *
                  (double)(in_stack_fffffffffffff9d0->super_TPZFMatrix<double>).
                          super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                          _vptr_TPZSavable + local_320;
    }
    in_stack_fffffffffffff9c0 =
         (TPZManVector<double,_3> *)
         TPZFMatrix<double>::operator()
                   (&in_stack_fffffffffffff9b0->super_TPZFMatrix<double>,
                    (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
    in_stack_fffffffffffff9a8 =
         (_func_int **)
         (local_320 + (double)(in_stack_fffffffffffff9c0->super_TPZVec<double>)._vptr_TPZVec);
    in_stack_fffffffffffff9b0 =
         (TPZFNMatrix<9,_double> *)
         TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x1e0),(long)local_324);
    (in_stack_fffffffffffff9b0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = in_stack_fffffffffffff9a8;
  }
  dVar13 = sqrt(*(double *)(in_RDI + 0x260) * *(double *)(in_RDI + 0x260) +
                *(double *)(in_RDI + 0x268) * *(double *)(in_RDI + 0x268));
  *(double *)(in_RDI + 600) = dVar13;
  TPZManVector<double,_3>::Resize
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff9d0,(int64_t)in_stack_fffffffffffff9c8
             ,(double *)in_stack_fffffffffffff9c0);
  dVar13 = local_2d8 - *(double *)(in_RDI + 0x260);
  pdVar11 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x218),0);
  *pdVar11 = dVar13;
  pp_Var15 = (_func_int **)(local_2e0 - *(double *)(in_RDI + 0x268));
  this_01 = (TPZVec<double> *)TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x218),1);
  this_01->_vptr_TPZVec = pp_Var15;
  TPZVec<double>::~TPZVec(this_01);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x17ef6ef);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x17ef6fc);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x17ef709);
  return;
}

Assistant:

void TPZArc3D::ComputeAtributes(TPZFMatrix<REAL> &coord)
{
#ifdef PZDEBUG
	/** Cross[(mid-ini),(fin-ini)] */
	double CrossX, CrossY, CrossZ;
	try
	{
		CrossX = fabs(-(coord(1,1)*coord(2,0)) + coord(1,2)*coord(2,0) + coord(1,0)*coord(2,1) - coord(1,2)*coord(2,1) - coord(1,0)*coord(2,2) + coord(1,1)*coord(2,2));
		CrossY = fabs(coord(0,1)*coord(2,0) - coord(0,2)*coord(2,0) - coord(0,0)*coord(2,1) + coord(0,2)*coord(2,1) + coord(0,0)*coord(2,2) - coord(0,1)*coord(2,2));
		CrossZ = fabs(-(coord(0,1)*coord(1,0)) + coord(0,2)*coord(1,0) + coord(0,0)*coord(1,1) - coord(0,2)*coord(1,1) - coord(0,0)*coord(1,2) + coord(0,1)*coord(1,2));	
	}
	catch(...){
		std::cout << "Arc3D element with nodes coordinates non initialized!!!\n";
		DebugStop();
	}
	
	/** If Cross[(mid-ini),(fin-ini)] == 0, than the 3 given points are co-linear */
	if(CrossX <= 1.E-6 && CrossY <= 1.E-6 && CrossZ <= 1.E-6)
	{
		cout << "The 3 given points that define an TPZArc3D are co-linear!\n";
		cout << "Method aborted!";
		
		DebugStop();
	}
#endif
	
	/** fIBaseCn -> Basis Change Matrix: from Base(R2) to Canonic(R3) | fIBaseCn 1st column = BaseX | fIBaseCn 2nd column = BaseY */
	TPZFNMatrix<9> IBaseCnCP(3,3,0.), NotUsedHere(3,3,0.);
	fIBaseCn.Resize(3,3); fICnBase.Resize(3,3); fCenter3D.Resize(3);
	for(int i = 0; i < 3; i++)
	{
		IBaseCnCP(i,0) = coord(i,0) - coord(i,2);
		IBaseCnCP(i,1) = coord(i,1) - coord(i,2);
	}
	
	/** fIBaseCn 3rd column = BaseZ = Cross[BaseX,BaseY] |  */
	IBaseCnCP(0,2) = -coord(1,1)*coord(2,0) + coord(1,2)*coord(2,0) + coord(1,0)*coord(2,1) - coord(1,2)*coord(2,1) - coord(1,0)*coord(2,2) + coord(1,1)*coord(2,2);
	IBaseCnCP(1,2) =  coord(0,1)*coord(2,0) - coord(0,2)*coord(2,0) - coord(0,0)*coord(2,1) + coord(0,2)*coord(2,1) + coord(0,0)*coord(2,2) - coord(0,1)*coord(2,2);
	IBaseCnCP(2,2) = -coord(0,1)*coord(1,0) + coord(0,2)*coord(1,0) + coord(0,0)*coord(1,1) - coord(0,2)*coord(1,1) - coord(0,0)*coord(1,2) + coord(0,1)*coord(1,2);
	
	TPZFNMatrix<9> axest(IBaseCnCP.Rows(),IBaseCnCP.Cols());
	IBaseCnCP.GramSchmidt(axest,NotUsedHere);
	
	fIBaseCn = axest;
	axest.Transpose(&fICnBase);
	
	/** fICnBase -> Basis Change Matrix: from Canonic(R3) to Base(R2) | fICnBase(i,0) = Inverse[fIBaseCn] */
	//	fIBaseCn = fICnBase; fIBaseCn.Transpose();
	
	double Xa, Ya, Xb, Yb;
	ComputeR2Points(coord,Xa,Ya,Xb,Yb);
	
	/** Computing the Center Coordinates in R2 base */
	fXcenter = Xa/2.;
	fYcenter = (-Xa*Xb + Xb*Xb + Yb*Yb) / (2.*Yb);
	
	/** Computing the Center Coordinates in R3 base */
	TPZVec<REAL> Temp(3,0.);
	Temp[0] = fXcenter; Temp[1] = fYcenter; Temp[2] = 0.; double temp = 0.;
	for(int i = 0; i < 3; i++)
	{
		for(int j = 0; j < 3; j++) temp += fIBaseCn(i,j)*Temp[j];
		fCenter3D[i] = temp + coord(i,2);
		temp = 0.;
	}
	
	/** Computing Radius */
	fRadius = sqrt( fXcenter*fXcenter + fYcenter*fYcenter );
	
	/** Computing (Center->First_Point) vector */
	finitialVector.Resize(2,0.);
	finitialVector[0] = Xa - fXcenter; finitialVector[1] = Ya - fYcenter;
    
    
    
#ifdef PZDEBUG2
    
    TPZFNMatrix<9,REAL> nodes=coord;
    TPZManVector<REAL,1> loc(1,0.0);
    TPZManVector<REAL,3> result(3.);
    
    REAL resultlocminus1, resultloc0,resultlocplus1;
    
    loc[0] = -1.;
    X(nodes,loc,result);
    for (int i=0; i<3; i++) {
        result[i] -= nodes(i,0);
    }
    resultlocminus1 = Norm(result);
    
    //cout << result << endl;
    
    loc[0] = 1.;
    X(nodes,loc,result);
    for (int i=0; i<3; i++) {
        result[i] -= nodes(i,1);
    }
    resultlocplus1 = Norm(result);
    
    //cout << result << endl;
    loc[0] = 0.;
    X(nodes,loc,result);
    for (int i=0; i<3; i++) {
        result[i] -= nodes(i,2);
    }
    resultloc0 = Norm(result);
    //cout << result << endl;

    
    // testes
    /** If result* !=0 , o ponto mapeados e diferente da coordenada recebida  */
    if(resultlocminus1 >= 1.E-6 ) // loc = -1 ponto da esquerda do arco
    {
        cout << "Method aborted!";
        
        DebugStop();
    }
    if(resultlocplus1 >= 1.E-6) // loc = 1 ponto da direita do arco
    {
        cout << "Method aborted!";
        
        DebugStop();
    }
    if(resultloc0 >= 1.E-6) // loc = 0 ponto do centro do arco
    {

        cout << "Method aborted!";
        
        DebugStop();
    }
#endif
    
}